

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateVkImpl.cpp
# Opt level: O2

void Diligent::PipelineStateVkImpl::RemapOrVerifyShaderResources
               (TShaderStages *ShaderStages,
               RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *pSignatures,
               Uint32 SignatureCount,TBindIndexToDescSetIndex *BindIndexToDescSetIndex,
               bool bVerifyOnly,bool bStripReflection,char *PipelineName,
               TShaderResources *pDvpShaderResources,TResourceAttibutions *pDvpResourceAttibutions)

{
  PipelineResourceSignatureDesc *pPVar1;
  SHADER_TYPE SVar2;
  uint uVar3;
  long lVar4;
  pointer puVar5;
  PipelineResourceSignatureImplType *pPVar6;
  SHADER_RESOURCE_TYPE ResourceType;
  PIPELINE_RESOURCE_FLAGS ResourceFlags;
  shared_ptr<const_Diligent::SPIRVShaderResources> *__args;
  SPIRVShaderResourceAttribs *Args_3;
  PipelineResourceDesc *ResDesc;
  PipelineResourceAttribsType *pPVar7;
  ImmutableSamplerAttribsType *pIVar8;
  char (*Args_1) [32];
  char *Args_1_00;
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *Args_1_01;
  ulong uVar9;
  Uint32 UVar10;
  Uint32 n;
  undefined7 in_register_00000089;
  ShaderVkImpl *SignatureName;
  pointer pSVar11;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *SrcSPIRV;
  Uint32 UVar12;
  uint uVar13;
  char *pcVar14;
  char local_f1;
  ShaderVkImpl *local_f0;
  Uint32 ResourceBinding;
  string msg;
  ResourceAttribution ResAttribution;
  Uint32 SpvDescrSet;
  uint local_7c;
  PipelineResourceSignatureDesc *local_78;
  TShaderStages *local_70;
  ulong local_68;
  pointer local_60;
  char *local_58;
  TBindIndexToDescSetIndex *local_50;
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *local_48;
  SPIRVShaderResources *local_40;
  char *local_38;
  
  SignatureName = (ShaderVkImpl *)CONCAT71(in_register_00000089,bStripReflection);
  local_38 = "<null>";
  if (PipelineName != (char *)0x0) {
    local_38 = PipelineName;
  }
  uVar9 = 0;
  local_70 = ShaderStages;
  local_50 = BindIndexToDescSetIndex;
  local_48 = pSignatures;
  do {
    pSVar11 = (local_70->
              super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(local_70->
                       super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar11) / 0x38) <= uVar9
       ) {
      return;
    }
    SVar2 = pSVar11[uVar9].Type;
    Args_1 = (char (*) [32])
             ((long)*(pointer *)
                     ((long)&pSVar11[uVar9].Shaders.
                             super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                             ._M_impl + 8) -
              *(long *)&pSVar11[uVar9].Shaders.
                        super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                        ._M_impl >> 3);
    local_68 = uVar9;
    if (Args_1 != (char (*) [32])
                  (((long)*(pointer *)
                           ((long)&pSVar11[uVar9].SPIRVs.
                                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   ._M_impl + 8) -
                   *(long *)&pSVar11[uVar9].SPIRVs.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl) / 0x18)) {
      FormatString<char[26],char[32]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Shaders.size() == SPIRVs.size()",Args_1);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"RemapOrVerifyShaderResources",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                 ,0x2a5);
      std::__cxx11::string::~string((string *)&msg);
    }
    pSVar11 = pSVar11 + uVar9;
    pcVar14 = (char *)0x0;
    local_60 = pSVar11;
    while( true ) {
      lVar4 = *(long *)&(pSVar11->Shaders).
                        super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                        ._M_impl.super__Vector_impl_data;
      Args_1_00 = (char *)((long)*(pointer *)
                                  ((long)&(pSVar11->Shaders).
                                          super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                                          ._M_impl + 8) - lVar4 >> 3);
      if (Args_1_00 <= pcVar14) break;
      local_f0 = *(ShaderVkImpl **)(lVar4 + (long)pcVar14 * 8);
      SrcSPIRV = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)pcVar14 * 0x18 +
                 *(long *)&(pSVar11->SPIRVs).
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data);
      __args = ShaderVkImpl::GetShaderResources(local_f0);
      if ((__args->
          super___shared_ptr<const_Diligent::SPIRVShaderResources,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr == (element_type *)0x0) {
        FormatString<char[26],char[17]>
                  (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"pShaderResources",
                   (char (*) [17])Args_1_00);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"RemapOrVerifyShaderResources",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0x2ad);
        std::__cxx11::string::~string((string *)&msg);
      }
      local_58 = pcVar14;
      if (pDvpShaderResources != (TShaderResources *)0x0) {
        std::
        vector<std::shared_ptr<Diligent::SPIRVShaderResources_const>,std::allocator<std::shared_ptr<Diligent::SPIRVShaderResources_const>>>
        ::emplace_back<std::shared_ptr<Diligent::SPIRVShaderResources_const>const&>
                  ((vector<std::shared_ptr<Diligent::SPIRVShaderResources_const>,std::allocator<std::shared_ptr<Diligent::SPIRVShaderResources_const>>>
                    *)pDvpShaderResources,__args);
      }
      local_40 = (__args->
                 super___shared_ptr<const_Diligent::SPIRVShaderResources,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
      local_f0 = (ShaderVkImpl *)
                 &(local_f0->super_ShaderBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
                  .m_Desc;
      for (n = 0; pcVar14 = local_58, pSVar11 = local_60, n < local_40->m_TotalResources; n = n + 1)
      {
        Args_3 = SPIRVShaderResources::GetResource(local_40,n);
        Args_1_01 = local_48;
        PipelineStateBase<Diligent::EngineVkImplTraits>::
        GetResourceAttribution<Diligent::RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>>
                  (&ResAttribution,(PipelineStateBase<Diligent::EngineVkImplTraits> *)Args_3->Name,
                   (char *)(ulong)SVar2,(SHADER_TYPE)local_48,
                   (RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)(ulong)SignatureCount
                   ,(Uint32)SignatureName);
        if ((ResAttribution.SignatureIndex == 0xffffffff) ||
           ((ResAttribution.ResourceIndex == 0xffffffff &&
            (ResAttribution.ImmutableSamplerIndex == 0xffffffff)))) {
          Args_1_01 = (RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)0x2ba;
          SignatureName = local_f0;
          LogError<true,char[9],char_const*,char[22],char_const*,char[89],char_const*,char[3]>
                    (false,"operator()",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                     ,0x2ba,(char (*) [9])"Shader \'",(char **)local_f0,
                     (char (*) [22])"\' contains resource \'",&Args_3->Name,
                     (char (*) [89])
                     "\' that is not present in any pipeline resource signature used to create pipeline state \'"
                     ,&local_38,(char (*) [3])"\'.");
        }
        pPVar6 = ResAttribution.pSignature;
        pPVar1 = &((ResAttribution.pSignature)->
                  super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                  .m_Desc;
        ResourceType = SPIRVShaderResourceAttribs::GetShaderResourceType(Args_3->Type);
        ResourceFlags = SPIRVShaderResourceAttribs::GetPipelineResourceFlags(Args_3->Type);
        ResourceBinding = 0xffffffff;
        local_78 = pPVar1;
        if (ResAttribution.ResourceIndex == 0xffffffff) {
          if (ResAttribution.ImmutableSamplerIndex != 0xffffffff) {
            if (ResourceType != SHADER_RESOURCE_TYPE_SAMPLER) {
              msg._M_dataplus._M_p = GetShaderResourceTypeLiteralName(ResourceType,false);
              Args_1_01 = (RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)0x2d4;
              SignatureName = local_f0;
              LogError<true,char[9],char_const*,char[32],char_const*,char[13],char_const*,char[89],char_const*,char[3]>
                        (false,"operator()",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                         ,0x2d4,(char (*) [9])"Shader \'",(char **)local_f0,
                         (char (*) [32])"\' contains resource with name \'",&Args_3->Name,
                         (char (*) [13])"\' and type \'",(char **)&msg,
                         (char (*) [89])
                         "\' that is not compatible with immutable sampler defined in pipeline resource signature \'"
                         ,(char **)local_78,(char (*) [3])"\'.");
            }
            pIVar8 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::
                     GetImmutableSamplerAttribs
                               (&(ResAttribution.pSignature)->
                                 super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                                ResAttribution.ImmutableSamplerIndex);
            UVar10 = pIVar8->BindingIndex;
            UVar12 = pIVar8->DescrSet;
            goto LAB_001fb30a;
          }
          FormatString<char[59]>
                    (&msg,(char (*) [59])
                          "Either immutable sampler or resource index should be valid");
          Args_1_01 = (RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)0x2dc;
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"operator()",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                     ,0x2dc);
          std::__cxx11::string::~string((string *)&msg);
          UVar12 = 0xffffffff;
          UVar10 = UVar12;
LAB_001fb35c:
          FormatString<char[26],char[47]>
                    (&msg,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"ResourceBinding != ~0u && DescriptorSet != ~0u",
                     (char (*) [47])Args_1_01);
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"operator()",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                     ,0x2df);
          std::__cxx11::string::~string((string *)&msg);
        }
        else {
          ResDesc = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceDesc
                              (&(ResAttribution.pSignature)->
                                super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                               ResAttribution.ResourceIndex);
          Args_1_01 = (RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)
                      (ulong)Args_3->ArraySize;
          SignatureName = (ShaderVkImpl *)(pPVar1->super_DeviceObjectAttribs).Name;
          ValidatePipelineResourceCompatibility
                    (ResDesc,ResourceType,ResourceFlags,(uint)Args_3->ArraySize,
                     ((DeviceObjectAttribs *)
                     &local_f0->super_ShaderBase<Diligent::EngineVkImplTraits>)->Name,
                     (char *)SignatureName);
          pPVar7 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceAttribs
                             (&(ResAttribution.pSignature)->
                               super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                              ResAttribution.ResourceIndex);
          UVar10 = (uint)*(undefined8 *)pPVar7 & 0xffff;
          UVar12 = (uint)((ulong)*(undefined8 *)pPVar7 >> 0x3e) & 1;
LAB_001fb30a:
          ResourceBinding = UVar10;
          if ((UVar10 == 0xffffffff) || (UVar12 == 0xffffffff)) goto LAB_001fb35c;
        }
        pPVar1 = local_78;
        uVar13 = UVar12 + local_50->_M_elems
                          [(pPVar6->
                           super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                           super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                           .m_Desc.BindingIndex];
        local_7c = uVar13;
        if (bVerifyOnly) {
          puVar5 = (SrcSPIRV->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          UVar12 = puVar5[Args_3->BindingDecorationOffset];
          msg._M_dataplus._M_p._0_4_ = UVar12;
          uVar3 = puVar5[Args_3->DescriptorSetDecorationOffset];
          SpvDescrSet = uVar3;
          if (UVar12 != UVar10) {
            local_f1 = '.';
            SignatureName = local_f0;
            LogError<true,char[9],char_const*,char[18],char_const*,char[14],unsigned_int,char[57],char_const*,char[24],unsigned_int,char>
                      (false,"operator()",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                       ,0x2e9,(char (*) [9])"Shader \'",(char **)local_f0,
                       (char (*) [18])"\' maps resource \'",&Args_3->Name,
                       (char (*) [14])"\' to binding ",(uint *)&msg,
                       (char (*) [57])", but the same resource in pipeline resource signature \'",
                       (char **)local_78,(char (*) [24])"\' is mapped to binding ",&ResourceBinding,
                       &local_f1);
          }
          if (uVar3 != uVar13) {
            local_f1 = '.';
            SignatureName = local_f0;
            LogError<true,char[9],char_const*,char[18],char_const*,char[21],unsigned_int,char[57],char_const*,char[20],unsigned_int,char>
                      (false,"operator()",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                       ,0x2ef,(char (*) [9])"Shader \'",(char **)local_f0,
                       (char (*) [18])"\' maps resource \'",&Args_3->Name,
                       (char (*) [21])"\' to descriptor set ",&SpvDescrSet,
                       (char (*) [57])", but the same resource in pipeline resource signature \'",
                       (char **)pPVar1,(char (*) [20])"\' is mapped to set ",&local_7c,&local_f1);
          }
        }
        else {
          puVar5 = (SrcSPIRV->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          puVar5[Args_3->BindingDecorationOffset] = UVar10;
          puVar5[Args_3->DescriptorSetDecorationOffset] = uVar13;
        }
        if (pDvpResourceAttibutions != (TResourceAttibutions *)0x0) {
          std::
          vector<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ResourceAttribution,std::allocator<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ResourceAttribution>>
          ::
          emplace_back<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ResourceAttribution_const&>
                    ((vector<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ResourceAttribution,std::allocator<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ResourceAttribution>>
                      *)pDvpResourceAttibutions,&ResAttribution);
        }
      }
      if (bStripReflection) {
        OptimizeSPIRV((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&msg,SrcSPIRV,
                      SPV_ENV_MAX,
                      ((__args->
                       super___shared_ptr<const_Diligent::SPIRVShaderResources,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr)->m_IsHLSLSource | SPIRV_OPTIMIZATION_FLAG_STRIP_REFLECTION);
        if (msg._M_dataplus._M_p == (pointer)msg._M_string_length) {
          SignatureName = local_f0;
          LogError<false,char[53],char_const*,char[51]>
                    (false,"RemapOrVerifyShaderResources",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                     ,0x30c,(char (*) [53])"Failed to strip reflection information from shader \'",
                     (char **)local_f0,
                     (char (*) [51])"\'. This may indicate a problem with the byte code.");
        }
        else {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(SrcSPIRV);
        }
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&msg);
      }
      pcVar14 = pcVar14 + 1;
    }
    uVar9 = local_68 + 1;
  } while( true );
}

Assistant:

void PipelineStateVkImpl::RemapOrVerifyShaderResources(
    TShaderStages&                                       ShaderStages,
    const RefCntAutoPtr<PipelineResourceSignatureVkImpl> pSignatures[],
    const Uint32                                         SignatureCount,
    const TBindIndexToDescSetIndex&                      BindIndexToDescSetIndex,
    bool                                                 bVerifyOnly,
    bool                                                 bStripReflection,
    const char*                                          PipelineName,
    TShaderResources*                                    pDvpShaderResources,
    TResourceAttibutions*                                pDvpResourceAttibutions) noexcept(false)
{
    if (PipelineName == nullptr)
        PipelineName = "<null>";

    // Verify that pipeline layout is compatible with shader resources and
    // remap resource bindings.
    for (size_t s = 0; s < ShaderStages.size(); ++s)
    {
        const std::vector<const ShaderVkImpl*>& Shaders    = ShaderStages[s].Shaders;
        std::vector<std::vector<uint32_t>>&     SPIRVs     = ShaderStages[s].SPIRVs;
        const SHADER_TYPE                       ShaderType = ShaderStages[s].Type;

        VERIFY_EXPR(Shaders.size() == SPIRVs.size());

        for (size_t i = 0; i < Shaders.size(); ++i)
        {
            const ShaderVkImpl*    pShader = Shaders[i];
            std::vector<uint32_t>& SPIRV   = SPIRVs[i];

            const auto& pShaderResources = pShader->GetShaderResources();
            VERIFY_EXPR(pShaderResources);

            if (pDvpShaderResources)
                pDvpShaderResources->emplace_back(pShaderResources);

            pShaderResources->ProcessResources(
                [&](const SPIRVShaderResourceAttribs& SPIRVAttribs, Uint32) //
                {
                    const ResourceAttribution ResAttribution = GetResourceAttribution(SPIRVAttribs.Name, ShaderType, pSignatures, SignatureCount);
                    if (!ResAttribution)
                    {
                        LOG_ERROR_AND_THROW("Shader '", pShader->GetDesc().Name, "' contains resource '", SPIRVAttribs.Name,
                                            "' that is not present in any pipeline resource signature used to create pipeline state '",
                                            PipelineName, "'.");
                    }

                    const PipelineResourceSignatureDesc& SignDesc = ResAttribution.pSignature->GetDesc();
                    const SHADER_RESOURCE_TYPE           ResType  = SPIRVShaderResourceAttribs::GetShaderResourceType(SPIRVAttribs.Type);
                    const PIPELINE_RESOURCE_FLAGS        Flags    = SPIRVShaderResourceAttribs::GetPipelineResourceFlags(SPIRVAttribs.Type);

                    Uint32 ResourceBinding = ~0u;
                    Uint32 DescriptorSet   = ~0u;
                    if (ResAttribution.ResourceIndex != ResourceAttribution::InvalidResourceIndex)
                    {
                        const PipelineResourceDesc& ResDesc = ResAttribution.pSignature->GetResourceDesc(ResAttribution.ResourceIndex);
                        ValidatePipelineResourceCompatibility(ResDesc, ResType, Flags, SPIRVAttribs.ArraySize,
                                                              pShader->GetDesc().Name, SignDesc.Name);

                        const PipelineResourceSignatureVkImpl::ResourceAttribs& ResAttribs{ResAttribution.pSignature->GetResourceAttribs(ResAttribution.ResourceIndex)};
                        ResourceBinding = ResAttribs.BindingIndex;
                        DescriptorSet   = ResAttribs.DescrSet;
                    }
                    else if (ResAttribution.ImmutableSamplerIndex != ResourceAttribution::InvalidResourceIndex)
                    {
                        if (ResType != SHADER_RESOURCE_TYPE_SAMPLER)
                        {
                            LOG_ERROR_AND_THROW("Shader '", pShader->GetDesc().Name, "' contains resource with name '", SPIRVAttribs.Name,
                                                "' and type '", GetShaderResourceTypeLiteralName(ResType),
                                                "' that is not compatible with immutable sampler defined in pipeline resource signature '",
                                                SignDesc.Name, "'.");
                        }
                        const ImmutableSamplerAttribsVk& SamAttribs{ResAttribution.pSignature->GetImmutableSamplerAttribs(ResAttribution.ImmutableSamplerIndex)};
                        ResourceBinding = SamAttribs.BindingIndex;
                        DescriptorSet   = SamAttribs.DescrSet;
                    }
                    else
                    {
                        UNEXPECTED("Either immutable sampler or resource index should be valid");
                    }

                    VERIFY_EXPR(ResourceBinding != ~0u && DescriptorSet != ~0u);
                    DescriptorSet += BindIndexToDescSetIndex[SignDesc.BindingIndex];
                    if (bVerifyOnly)
                    {
                        const Uint32 SpvBinding  = SPIRV[SPIRVAttribs.BindingDecorationOffset];
                        const Uint32 SpvDescrSet = SPIRV[SPIRVAttribs.DescriptorSetDecorationOffset];
                        if (SpvBinding != ResourceBinding)
                        {
                            LOG_ERROR_AND_THROW("Shader '", pShader->GetDesc().Name, "' maps resource '", SPIRVAttribs.Name,
                                                "' to binding ", SpvBinding, ", but the same resource in pipeline resource signature '",
                                                SignDesc.Name, "' is mapped to binding ", ResourceBinding, '.');
                        }
                        if (SpvDescrSet != DescriptorSet)
                        {
                            LOG_ERROR_AND_THROW("Shader '", pShader->GetDesc().Name, "' maps resource '", SPIRVAttribs.Name,
                                                "' to descriptor set ", SpvDescrSet, ", but the same resource in pipeline resource signature '",
                                                SignDesc.Name, "' is mapped to set ", DescriptorSet, '.');
                        }
                    }
                    else
                    {
                        SPIRV[SPIRVAttribs.BindingDecorationOffset]       = ResourceBinding;
                        SPIRV[SPIRVAttribs.DescriptorSetDecorationOffset] = DescriptorSet;
                    }

                    if (pDvpResourceAttibutions)
                        pDvpResourceAttibutions->emplace_back(ResAttribution);
                });

            if (bStripReflection)
            {
#if !DILIGENT_NO_HLSL
                // We have to strip reflection instructions to fix the following validation error:
                //     SPIR-V module not valid: DecorateStringGOOGLE requires one of the following extensions: SPV_GOOGLE_decorate_string
                // Optimizer also performs validation and may catch problems with the byte code.
                // NB: SPIRV offsets become INVALID after this operation.
                SPIRV_OPTIMIZATION_FLAGS OptimizationFlags = SPIRV_OPTIMIZATION_FLAG_STRIP_REFLECTION;
                if (pShaderResources->IsHLSLSource())
                {
                    OptimizationFlags |= SPIRV_OPTIMIZATION_FLAG_LEGALIZATION;
                }
                std::vector<uint32_t> StrippedSPIRV = OptimizeSPIRV(SPIRV, SPV_ENV_MAX, OptimizationFlags);
                if (!StrippedSPIRV.empty())
                    SPIRV = std::move(StrippedSPIRV);
                else
                    LOG_ERROR("Failed to strip reflection information from shader '", pShader->GetDesc().Name, "'. This may indicate a problem with the byte code.");
#endif
            }
        }
    }
}